

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O3

void __thiscall MyDB_LRU::MyDB_LRU(MyDB_LRU *this,int size)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  Node *pNVar3;
  
  p_Var1 = &(this->LRUmap)._M_t._M_impl.super__Rb_tree_header;
  (this->LRUmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LRUmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LRUmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LRUmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LRUmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size = size;
  pNVar2 = (Node *)operator_new(0x18);
  pNVar2->pre = (Node *)0x0;
  pNVar2->next = (Node *)0x0;
  pNVar2->page = (MyDB_PageBase *)0x0;
  this->head = pNVar2;
  pNVar3 = (Node *)operator_new(0x18);
  pNVar3->pre = (Node *)0x0;
  pNVar3->next = (Node *)0x0;
  pNVar3->page = (MyDB_PageBase *)0x0;
  this->tail = pNVar3;
  pNVar2->next = pNVar3;
  pNVar3->pre = pNVar2;
  return;
}

Assistant:

MyDB_LRU:: MyDB_LRU(int size) {
    this -> size = size;
    this -> head = new Node();
    this -> tail = new Node();
    this -> head -> next = this -> tail;
    this -> tail -> pre = this -> head;
}